

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O2

btScalar __thiscall
btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup
          (btSequentialImpulseConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  uint newsize;
  btRigidBody *pbVar1;
  btSolverBody *pbVar2;
  btConstraintInfo1 *pbVar3;
  undefined8 *puVar4;
  btSolverBody *pbVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  btTypedConstraint *pbVar12;
  long *plVar13;
  int i;
  long lVar14;
  btVector3 *v;
  btSequentialImpulseConstraintSolver *this_00;
  int *piVar15;
  btTypedConstraint **ppbVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  float fVar17;
  uint uVar18;
  uint uVar19;
  btVector3 bVar20;
  CProfileSample __profile;
  btConstraintInfo2 info2;
  CProfileSample local_2c9;
  btVector3 local_2c8;
  btTypedConstraint **local_2b0;
  btTypedConstraint *local_2a8;
  btSequentialImpulseConstraintSolver *local_2a0;
  ulong local_298;
  uint local_290;
  int local_28c;
  float local_288;
  float local_284;
  float local_280;
  float local_27c;
  undefined1 local_278 [16];
  ulong local_268;
  btSolverBody *local_260;
  btSolverBody *local_258;
  btRigidBody *local_250;
  btRigidBody *local_248;
  btConstraintInfo1 *local_240;
  undefined1 local_238 [8];
  uint uStack_230;
  uint uStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  btPersistentManifold **local_1e0;
  btVector3 *local_1d8;
  btVector3 *local_1d0;
  btVector3 *local_1c8;
  btVector3 *local_1c0;
  btVector3 *local_1b8;
  btVector3 *local_1b0;
  btVector3 *local_1a8;
  btVector3 *local_1a0;
  btMatrix3x3 *local_198;
  btMatrix3x3 *local_190;
  btVector3 local_188;
  btVector3 local_178;
  btVector3 local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  btVector3 *local_118;
  btVector3 *local_110;
  btVector3 *local_108;
  btScalar local_100;
  btVector3 *local_f8;
  btScalar *local_f0;
  btScalar *local_e8;
  btScalar *local_e0;
  btScalar local_d0;
  btScalar local_cc;
  
  this->m_fixedBodyId = -1;
  local_290 = numManifolds;
  local_1e0 = manifoldPtr;
  CProfileManager::Start_Profile("solveGroupCacheFriendlySetup");
  this->m_maxOverrideNumSolverIterations = 0;
  uVar10 = 0;
  uVar11 = 0;
  if (0 < numBodies) {
    uVar11 = (ulong)(uint)numBodies;
  }
  for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    bodies[uVar10]->m_companionId = -1;
  }
  local_2b0 = constraints;
  btAlignedObjectArray<btSolverBody>::reserve(&this->m_tmpSolverBodyPool,numBodies + 1);
  memset((btSolverBody *)local_128,0,0xf8);
  btAlignedObjectArray<btSolverBody>::resize(&this->m_tmpSolverBodyPool,0,(btSolverBody *)local_128)
  ;
  local_2a0 = this;
  for (uVar10 = 0; this_00 = local_2a0, ppbVar16 = local_2b0, uVar11 != uVar10; uVar10 = uVar10 + 1)
  {
    iVar6 = getOrInitSolverBody(local_2a0,bodies[uVar10],
                                (infoGlobal->super_btContactSolverInfoData).m_timeStep);
    pbVar1 = (btRigidBody *)bodies[uVar10];
    if (((pbVar1 != (btRigidBody *)0x0) &&
        (((pbVar1->super_btCollisionObject).m_internalType & 2U) != 0)) &&
       ((pbVar1->m_inverseMass != 0.0 || (NAN(pbVar1->m_inverseMass))))) {
      pbVar2 = (local_2a0->m_tmpSolverBodyPool).m_data;
      local_128 = ZEXT816(0);
      uVar18 = pbVar1->m_rigidbodyFlags;
      if ((uVar18 & 2) != 0) {
        local_128 = (undefined1  [16])
                    btRigidBody::computeGyroscopicForceExplicit
                              (pbVar1,(infoGlobal->super_btContactSolverInfoData).
                                      m_maxGyroscopicForce);
        bVar20 = operator*((btVector3 *)local_128,
                           (btMatrix3x3 *)&(pbVar1->super_btCollisionObject).field_0x14c);
        fVar17 = (infoGlobal->super_btContactSolverInfoData).m_timeStep;
        local_2c8.m_floats[1] = bVar20.m_floats[1] * fVar17;
        local_2c8.m_floats[0] = bVar20.m_floats[0] * fVar17;
        local_2c8.m_floats[2] = bVar20.m_floats[2] * fVar17;
        local_2c8.m_floats[3] = 0.0;
        btVector3::operator-=(&pbVar2[iVar6].m_externalTorqueImpulse,&local_2c8);
        uVar18 = pbVar1->m_rigidbodyFlags;
      }
      if ((uVar18 & 4) != 0) {
        local_128 = (undefined1  [16])
                    btRigidBody::computeGyroscopicImpulseImplicit_World
                              (pbVar1,(infoGlobal->super_btContactSolverInfoData).m_timeStep);
        btVector3::operator+=(&pbVar2[iVar6].m_externalTorqueImpulse,(btVector3 *)local_128);
        uVar18 = pbVar1->m_rigidbodyFlags;
      }
      if ((uVar18 & 8) != 0) {
        local_128 = (undefined1  [16])
                    btRigidBody::computeGyroscopicImpulseImplicit_Body
                              (pbVar1,(infoGlobal->super_btContactSolverInfoData).m_timeStep);
        btVector3::operator+=(&pbVar2[iVar6].m_externalTorqueImpulse,(btVector3 *)local_128);
      }
    }
  }
  uVar10 = 0;
  uVar11 = 0;
  if (0 < numConstraints) {
    uVar11 = (ulong)(uint)numConstraints;
  }
  for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    pbVar12 = ppbVar16[uVar10];
    (*pbVar12->_vptr_btTypedConstraint[2])(pbVar12);
    pbVar12->m_appliedImpulse = 0.0;
  }
  btAlignedObjectArray<btTypedConstraint::btConstraintInfo1>::resizeNoInitialize
            (&this_00->m_tmpConstraintSizesPool,numConstraints);
  iVar6 = 0;
  local_268 = uVar11;
  for (lVar14 = 0; uVar11 * 8 - lVar14 != 0; lVar14 = lVar14 + 8) {
    pbVar3 = (this_00->m_tmpConstraintSizesPool).m_data;
    plVar13 = *(long **)((long)local_2b0 + lVar14);
    puVar4 = (undefined8 *)plVar13[8];
    if (puVar4 != (undefined8 *)0x0) {
      puVar4[6] = 0;
      puVar4[7] = 0;
      puVar4[4] = 0;
      puVar4[5] = 0;
      puVar4[2] = 0;
      puVar4[3] = 0;
      *puVar4 = 0;
      puVar4[1] = 0;
      plVar13 = *(long **)((long)local_2b0 + lVar14);
    }
    if (*(char *)((long)plVar13 + 0x1c) == '\x01') {
      piVar15 = (int *)((long)&pbVar3->m_numConstraintRows + lVar14);
      (**(code **)(*plVar13 + 0x20))(plVar13,piVar15);
      iVar7 = *piVar15;
    }
    else {
      *(undefined8 *)((long)&pbVar3->m_numConstraintRows + lVar14) = 0;
      iVar7 = 0;
    }
    iVar6 = iVar6 + iVar7;
  }
  btAlignedObjectArray<btSolverConstraint>::resizeNoInitialize
            (&this_00->m_tmpSolverNonContactConstraintPool,iVar6);
  uVar10 = 0;
  iVar6 = 0;
  uVar11 = local_268;
  ppbVar16 = local_2b0;
  do {
    if (uVar10 == uVar11) {
      (*(this_00->super_btConstraintSolver)._vptr_btConstraintSolver[7])
                (this_00,local_1e0,(ulong)local_290,infoGlobal);
      uVar18 = (this_00->m_tmpSolverContactConstraintPool).m_size;
      uVar19 = (this_00->m_tmpSolverNonContactConstraintPool).m_size;
      newsize = (this_00->m_tmpSolverContactFrictionConstraintPool).m_size;
      btAlignedObjectArray<int>::resizeNoInitialize
                (&this_00->m_orderNonContactConstraintPool,uVar19);
      btAlignedObjectArray<int>::resizeNoInitialize
                (&this_00->m_orderTmpConstraintPool,
                 uVar18 << ((byte)(infoGlobal->super_btContactSolverInfoData).m_solverMode >> 4 & 1)
                );
      btAlignedObjectArray<int>::resizeNoInitialize(&this_00->m_orderFrictionConstraintPool,newsize)
      ;
      piVar15 = (this_00->m_orderNonContactConstraintPool).m_data;
      uVar11 = 0;
      uVar10 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar10 = uVar11;
      }
      for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        piVar15[uVar11] = (int)uVar11;
      }
      piVar15 = (this_00->m_orderTmpConstraintPool).m_data;
      uVar11 = 0;
      uVar10 = (ulong)uVar18;
      if ((int)uVar18 < 1) {
        uVar10 = uVar11;
      }
      for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        piVar15[uVar11] = (int)uVar11;
      }
      piVar15 = (this_00->m_orderFrictionConstraintPool).m_data;
      uVar11 = 0;
      uVar10 = (ulong)newsize;
      if ((int)newsize < 1) {
        uVar10 = uVar11;
      }
      for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        piVar15[uVar11] = (int)uVar11;
      }
      CProfileSample::~CProfileSample(&local_2c9);
      return 0.0;
    }
    local_240 = (this_00->m_tmpConstraintSizesPool).m_data;
    if (local_240[uVar10].m_numConstraintRows == 0) {
      iVar7 = 0;
    }
    else {
      local_278._0_8_ = (this_00->m_tmpSolverNonContactConstraintPool).m_data;
      local_2a8 = ppbVar16[uVar10];
      local_248 = local_2a8->m_rbA;
      pbVar1 = local_2a8->m_rbB;
      local_298 = uVar10;
      iVar8 = getOrInitSolverBody(this_00,&local_248->super_btCollisionObject,
                                  (infoGlobal->super_btContactSolverInfoData).m_timeStep);
      iVar9 = getOrInitSolverBody(this_00,&pbVar1->super_btCollisionObject,
                                  (infoGlobal->super_btContactSolverInfoData).m_timeStep);
      iVar7 = local_2a8->m_overrideNumSolverIterations;
      if (iVar7 < 1) {
        iVar7 = (infoGlobal->super_btContactSolverInfoData).m_numIterations;
      }
      if (this_00->m_maxOverrideNumSolverIterations < iVar7) {
        this_00->m_maxOverrideNumSolverIterations = iVar7;
      }
      v = (btVector3 *)(local_278._0_8_ + (long)iVar6 * 0xa0);
      local_260 = (this_00->m_tmpSolverBodyPool).m_data;
      local_258 = local_260 + iVar8;
      local_260 = local_260 + iVar9;
      piVar15 = (int *)(local_278._0_8_ + (long)iVar6 * 0xa0 + 0x9c);
      local_28c = iVar6;
      local_250 = pbVar1;
      for (lVar14 = 0; pbVar5 = local_258, pbVar2 = local_260, ppbVar16 = local_2b0,
          lVar14 < local_240[local_298].m_numConstraintRows; lVar14 = lVar14 + 1) {
        memset(piVar15 + -0x27,0,0x98);
        piVar15[-9] = -0x800001;
        piVar15[-8] = 0x7f7fffff;
        piVar15[-0xf] = 0;
        piVar15[-1] = iVar8;
        *piVar15 = iVar9;
        piVar15[-3] = iVar7;
        piVar15 = piVar15 + 0x28;
      }
      (local_258->m_deltaAngularVelocity).m_floats[0] = 0.0;
      (local_258->m_deltaAngularVelocity).m_floats[1] = 0.0;
      (local_258->m_deltaAngularVelocity).m_floats[2] = 0.0;
      (local_258->m_deltaAngularVelocity).m_floats[3] = 0.0;
      (local_258->m_deltaLinearVelocity).m_floats[0] = 0.0;
      (local_258->m_deltaLinearVelocity).m_floats[1] = 0.0;
      (local_258->m_deltaLinearVelocity).m_floats[2] = 0.0;
      (local_258->m_deltaLinearVelocity).m_floats[3] = 0.0;
      (local_258->m_pushVelocity).m_floats[0] = 0.0;
      (local_258->m_pushVelocity).m_floats[1] = 0.0;
      (local_258->m_pushVelocity).m_floats[2] = 0.0;
      (local_258->m_pushVelocity).m_floats[3] = 0.0;
      (local_258->m_turnVelocity).m_floats[0] = 0.0;
      (local_258->m_turnVelocity).m_floats[1] = 0.0;
      (local_258->m_turnVelocity).m_floats[2] = 0.0;
      (local_258->m_turnVelocity).m_floats[3] = 0.0;
      (local_260->m_deltaAngularVelocity).m_floats[0] = 0.0;
      (local_260->m_deltaAngularVelocity).m_floats[1] = 0.0;
      (local_260->m_deltaAngularVelocity).m_floats[2] = 0.0;
      (local_260->m_deltaAngularVelocity).m_floats[3] = 0.0;
      (local_260->m_deltaLinearVelocity).m_floats[0] = 0.0;
      (local_260->m_deltaLinearVelocity).m_floats[1] = 0.0;
      (local_260->m_deltaLinearVelocity).m_floats[2] = 0.0;
      (local_260->m_deltaLinearVelocity).m_floats[3] = 0.0;
      (local_260->m_pushVelocity).m_floats[0] = 0.0;
      (local_260->m_pushVelocity).m_floats[1] = 0.0;
      (local_260->m_pushVelocity).m_floats[2] = 0.0;
      (local_260->m_pushVelocity).m_floats[3] = 0.0;
      (local_260->m_turnVelocity).m_floats[0] = 0.0;
      (local_260->m_turnVelocity).m_floats[1] = 0.0;
      (local_260->m_turnVelocity).m_floats[2] = 0.0;
      (local_260->m_turnVelocity).m_floats[3] = 0.0;
      local_128._4_4_ = (infoGlobal->super_btContactSolverInfoData).m_erp;
      local_128._0_4_ = 1.0 / (infoGlobal->super_btContactSolverInfoData).m_timeStep;
      local_128._8_8_ = v + 1;
      local_110 = v + 3;
      local_108 = v + 2;
      local_100 = 5.60519e-44;
      local_f8 = v + 7;
      local_f0 = v[7].m_floats + 1;
      v[7].m_floats[1] = (infoGlobal->super_btContactSolverInfoData).m_globalCfm;
      local_cc = (infoGlobal->super_btContactSolverInfoData).m_damping;
      local_e8 = v[7].m_floats + 2;
      local_e0 = v[7].m_floats + 3;
      local_d0 = (btScalar)(infoGlobal->super_btContactSolverInfoData).m_numIterations;
      local_118 = v;
      (*local_2b0[local_298]->_vptr_btTypedConstraint[5])(local_2b0[local_298],local_128);
      local_190 = (btMatrix3x3 *)&(local_248->super_btCollisionObject).field_0x14c;
      local_198 = (btMatrix3x3 *)&(local_250->super_btCollisionObject).field_0x14c;
      local_1c0 = &pbVar5->m_externalForceImpulse;
      local_1d0 = &pbVar5->m_externalTorqueImpulse;
      local_1c8 = &pbVar2->m_externalForceImpulse;
      local_1d8 = &pbVar2->m_externalTorqueImpulse;
      local_1a0 = &local_248->m_linearVelocity;
      local_1a8 = &local_248->m_angularVelocity;
      local_1b0 = &local_250->m_linearVelocity;
      local_1b8 = &local_250->m_angularVelocity;
      pbVar12 = local_2a8;
      for (lVar14 = 0; lVar14 < local_240[local_298].m_numConstraintRows; lVar14 = lVar14 + 1) {
        uVar18 = 0;
        uVar19 = 0;
        fVar17 = ppbVar16[local_298]->m_breakingImpulseThreshold;
        if (fVar17 <= v[7].m_floats[3]) {
          v[7].m_floats[3] = fVar17;
        }
        if (v[7].m_floats[2] <= -fVar17) {
          v[7].m_floats[2] = -fVar17;
        }
        *(btTypedConstraint **)(v[8].m_floats + 2) = pbVar12;
        local_2c8 = operator*((btMatrix3x3 *)&(pbVar12->m_rbA->super_btCollisionObject).field_0x14c,
                              v);
        bVar20 = operator*(&local_2c8,&pbVar12->m_rbA->m_angularFactor);
        *&v[4].m_floats = bVar20.m_floats;
        local_2c8 = operator*((btMatrix3x3 *)&(pbVar12->m_rbB->super_btCollisionObject).field_0x14c,
                              v + 2);
        bVar20 = operator*(&local_2c8,&pbVar12->m_rbB->m_angularFactor);
        *&v[5].m_floats = bVar20.m_floats;
        local_2c8.m_floats[0] = local_248->m_inverseMass;
        bVar20 = operator*(v + 1,local_2c8.m_floats);
        local_278._8_4_ = extraout_XMM0_Dc;
        local_278._0_8_ = bVar20.m_floats._0_8_;
        local_278._12_4_ = extraout_XMM0_Dd;
        local_1f8._8_4_ = uVar18;
        local_1f8._0_8_ = bVar20.m_floats._8_8_;
        local_1f8._12_4_ = uVar19;
        bVar20 = operator*(local_190,v);
        uStack_230 = extraout_XMM0_Dc_00;
        local_238 = (undefined1  [8])bVar20.m_floats._0_8_;
        uStack_22c = extraout_XMM0_Dd_00;
        local_228._8_4_ = uVar18;
        local_228._0_8_ = bVar20.m_floats._8_8_;
        local_228._12_4_ = uVar19;
        local_2c8.m_floats[0] = local_250->m_inverseMass;
        bVar20 = operator*(v + 3,local_2c8.m_floats);
        local_218._8_4_ = extraout_XMM0_Dc_01;
        local_218._0_8_ = bVar20.m_floats._0_8_;
        local_218._12_4_ = extraout_XMM0_Dd_01;
        local_208._8_4_ = uVar18;
        local_208._0_8_ = bVar20.m_floats._8_8_;
        local_208._12_4_ = uVar19;
        bVar20 = operator*(local_198,v + 2);
        pbVar12 = local_2a8;
        fVar17 = bVar20.m_floats[2] * v[2].m_floats[2] +
                 v[2].m_floats[0] * bVar20.m_floats[0] + bVar20.m_floats[1] * v[2].m_floats[1] +
                 (float)local_208._0_4_ * v[3].m_floats[2] +
                 v[3].m_floats[0] * (float)local_218._0_4_ +
                 (float)local_218._4_4_ * v[3].m_floats[1] +
                 v->m_floats[2] * (float)local_228._0_4_ +
                 (float)local_238._0_4_ * v->m_floats[0] + v->m_floats[1] * (float)local_238._4_4_ +
                 v[1].m_floats[2] * (float)local_1f8._0_4_ +
                 (float)local_278._0_4_ * v[1].m_floats[0] +
                 v[1].m_floats[1] * (float)local_278._4_4_;
        uVar18 = uVar18 & 0x7fffffff;
        uVar19 = uVar19 & 0x7fffffff;
        v[6].m_floats[3] = (btScalar)(-(uint)(1.1920929e-07 < ABS(fVar17)) & (uint)(1.0 / fVar17));
        if (local_258->m_originalBody == (btRigidBody *)0x0) {
          local_2c8.m_floats = (btScalar  [4])ZEXT816(0);
LAB_0017961a:
          local_168.m_floats[0] = 0.0;
          local_168.m_floats[1] = 0.0;
          local_168.m_floats[2] = 0.0;
          local_168.m_floats[3] = 0.0;
        }
        else {
          local_2c8.m_floats = *&local_1c0->m_floats;
          if (local_258->m_originalBody == (btRigidBody *)0x0) goto LAB_0017961a;
          local_168.m_floats[0] = local_1d0->m_floats[0];
          local_168.m_floats[1] = local_1d0->m_floats[1];
          local_168.m_floats[2] = local_1d0->m_floats[2];
          local_168.m_floats[3] = local_1d0->m_floats[3];
        }
        if (local_260->m_originalBody == (btRigidBody *)0x0) {
          local_178.m_floats[0] = 0.0;
          local_178.m_floats[1] = 0.0;
          local_178.m_floats[2] = 0.0;
          local_178.m_floats[3] = 0.0;
LAB_00179669:
          local_188.m_floats[0] = 0.0;
          local_188.m_floats[1] = 0.0;
          local_188.m_floats[2] = 0.0;
          local_188.m_floats[3] = 0.0;
        }
        else {
          local_178.m_floats._0_8_ = *(undefined8 *)local_1c8->m_floats;
          local_178.m_floats._8_8_ = *(undefined8 *)(local_1c8->m_floats + 2);
          if (local_260->m_originalBody == (btRigidBody *)0x0) goto LAB_00179669;
          local_188.m_floats[0] = local_1d8->m_floats[0];
          local_188.m_floats[1] = local_1d8->m_floats[1];
          local_188.m_floats[2] = local_1d8->m_floats[2];
          local_188.m_floats[3] = local_1d8->m_floats[3];
        }
        bVar20 = operator+(local_1a0,&local_2c8);
        local_218._8_4_ = extraout_XMM0_Dc_02;
        local_218._0_8_ = bVar20.m_floats._0_8_;
        local_218._12_4_ = extraout_XMM0_Dd_02;
        local_1f8._8_4_ = uVar18;
        local_1f8._0_8_ = bVar20.m_floats._8_8_;
        local_1f8._12_4_ = uVar19;
        local_208._0_4_ = v[1].m_floats[0];
        local_228._0_4_ = v[1].m_floats[1];
        local_278._0_4_ = v[1].m_floats[2];
        bVar20 = operator+(local_1a8,&local_168);
        fStack_134 = bVar20.m_floats[1];
        local_138 = fStack_134 * v->m_floats[1];
        local_27c = v->m_floats[0] * bVar20.m_floats[0];
        local_238._4_4_ = bVar20.m_floats[3];
        local_238._0_4_ = bVar20.m_floats[2] * v->m_floats[2];
        uStack_230 = uVar18;
        uStack_22c = uVar19;
        fStack_130 = fStack_134;
        fStack_12c = fStack_134;
        bVar20 = operator+(local_1b0,&local_178);
        local_158._8_4_ = extraout_XMM0_Dc_03;
        local_158._0_8_ = bVar20.m_floats._0_8_;
        local_158._12_4_ = extraout_XMM0_Dd_03;
        local_148._8_4_ = uVar18;
        local_148._0_8_ = bVar20.m_floats._8_8_;
        local_148._12_4_ = uVar19;
        local_284 = v[3].m_floats[0];
        local_288 = v[3].m_floats[1];
        local_280 = v[3].m_floats[2];
        bVar20 = operator+(local_1b8,&local_188);
        v[7].m_floats[0] =
             (0.0 - (bVar20.m_floats[2] * v[2].m_floats[2] +
                     v[2].m_floats[0] * bVar20.m_floats[0] + bVar20.m_floats[1] * v[2].m_floats[1] +
                     local_280 * (float)local_148._0_4_ +
                     local_284 * (float)local_158._0_4_ + (float)local_158._4_4_ * local_288 +
                    (float)local_238._0_4_ + local_27c + local_138 +
                    (float)local_278._0_4_ * (float)local_1f8._0_4_ +
                    (float)local_208._0_4_ * (float)local_218._0_4_ +
                    (float)local_218._4_4_ * (float)local_228._0_4_) * local_cc) * v[6].m_floats[3]
             + v[7].m_floats[0] * v[6].m_floats[3];
        v[6].m_floats[1] = 0.0;
        v = v + 10;
      }
      iVar7 = (local_2a0->m_tmpConstraintSizesPool).m_data[local_298].m_numConstraintRows;
      uVar10 = local_298;
      uVar11 = local_268;
      this_00 = local_2a0;
      iVar6 = local_28c;
    }
    iVar6 = iVar6 + iVar7;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

btScalar btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup(btCollisionObject** bodies, int numBodies, btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	m_fixedBodyId = -1;
	BT_PROFILE("solveGroupCacheFriendlySetup");
	(void)debugDrawer;

	m_maxOverrideNumSolverIterations = 0;

#ifdef BT_ADDITIONAL_DEBUG
	 //make sure that dynamic bodies exist for all (enabled) constraints
	for (int i=0;i<numConstraints;i++)
	{
		btTypedConstraint* constraint = constraints[i];
		if (constraint->isEnabled())
		{
			if (!constraint->getRigidBodyA().isStaticOrKinematicObject())
			{
				bool found=false;
				for (int b=0;b<numBodies;b++)
				{

					if (&constraint->getRigidBodyA()==bodies[b])
					{
						found = true;
						break;
					}
				}
				btAssert(found);
			}
			if (!constraint->getRigidBodyB().isStaticOrKinematicObject())
			{
				bool found=false;
				for (int b=0;b<numBodies;b++)
				{
					if (&constraint->getRigidBodyB()==bodies[b])
					{
						found = true;
						break;
					}
				}
				btAssert(found);
			}
		}
	}
    //make sure that dynamic bodies exist for all contact manifolds
    for (int i=0;i<numManifolds;i++)
    {
        if (!manifoldPtr[i]->getBody0()->isStaticOrKinematicObject())
        {
            bool found=false;
            for (int b=0;b<numBodies;b++)
            {

                if (manifoldPtr[i]->getBody0()==bodies[b])
                {
                    found = true;
                    break;
                }
            }
            btAssert(found);
        }
        if (!manifoldPtr[i]->getBody1()->isStaticOrKinematicObject())
        {
            bool found=false;
            for (int b=0;b<numBodies;b++)
            {
                if (manifoldPtr[i]->getBody1()==bodies[b])
                {
                    found = true;
                    break;
                }
            }
            btAssert(found);
        }
    }
#endif //BT_ADDITIONAL_DEBUG


	for (int i = 0; i < numBodies; i++)
	{
		bodies[i]->setCompanionId(-1);
	}


	m_tmpSolverBodyPool.reserve(numBodies+1);
	m_tmpSolverBodyPool.resize(0);

	//btSolverBody& fixedBody = m_tmpSolverBodyPool.expand();
    //initSolverBody(&fixedBody,0);

	//convert all bodies


	for (int i=0;i<numBodies;i++)
	{
		int bodyId = getOrInitSolverBody(*bodies[i],infoGlobal.m_timeStep);

		btRigidBody* body = btRigidBody::upcast(bodies[i]);
		if (body && body->getInvMass())
		{
			btSolverBody& solverBody = m_tmpSolverBodyPool[bodyId];
			btVector3 gyroForce (0,0,0);
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_EXPLICIT)
			{
				gyroForce = body->computeGyroscopicForceExplicit(infoGlobal.m_maxGyroscopicForce);
				solverBody.m_externalTorqueImpulse -= gyroForce*body->getInvInertiaTensorWorld()*infoGlobal.m_timeStep;
			}
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_WORLD)
			{
				gyroForce = body->computeGyroscopicImpulseImplicit_World(infoGlobal.m_timeStep);
				solverBody.m_externalTorqueImpulse += gyroForce;
			}
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_BODY)
			{
				gyroForce = body->computeGyroscopicImpulseImplicit_Body(infoGlobal.m_timeStep);
				solverBody.m_externalTorqueImpulse += gyroForce;

			}
			

		}
	}

	if (1)
	{
		int j;
		for (j=0;j<numConstraints;j++)
		{
			btTypedConstraint* constraint = constraints[j];
			constraint->buildJacobian();
			constraint->internalSetAppliedImpulse(0.0f);
		}
	}

	//btRigidBody* rb0=0,*rb1=0;

	//if (1)
	{
		{

			int totalNumRows = 0;
			int i;

			m_tmpConstraintSizesPool.resizeNoInitialize(numConstraints);
			//calculate the total number of contraint rows
			for (i=0;i<numConstraints;i++)
			{
				btTypedConstraint::btConstraintInfo1& info1 = m_tmpConstraintSizesPool[i];
				btJointFeedback* fb = constraints[i]->getJointFeedback();
				if (fb)
				{
					fb->m_appliedForceBodyA.setZero();
					fb->m_appliedTorqueBodyA.setZero();
					fb->m_appliedForceBodyB.setZero();
					fb->m_appliedTorqueBodyB.setZero();
				}

				if (constraints[i]->isEnabled())
				{
				}
				if (constraints[i]->isEnabled())
				{
					constraints[i]->getInfo1(&info1);
				} else
				{
					info1.m_numConstraintRows = 0;
					info1.nub = 0;
				}
				totalNumRows += info1.m_numConstraintRows;
			}
			m_tmpSolverNonContactConstraintPool.resizeNoInitialize(totalNumRows);


			///setup the btSolverConstraints
			int currentRow = 0;

			for (i=0;i<numConstraints;i++)
			{
				const btTypedConstraint::btConstraintInfo1& info1 = m_tmpConstraintSizesPool[i];

				if (info1.m_numConstraintRows)
				{
					btAssert(currentRow<totalNumRows);

					btSolverConstraint* currentConstraintRow = &m_tmpSolverNonContactConstraintPool[currentRow];
					btTypedConstraint* constraint = constraints[i];
					btRigidBody& rbA = constraint->getRigidBodyA();
					btRigidBody& rbB = constraint->getRigidBodyB();

					int solverBodyIdA = getOrInitSolverBody(rbA,infoGlobal.m_timeStep);
                    int solverBodyIdB = getOrInitSolverBody(rbB,infoGlobal.m_timeStep);

                    btSolverBody* bodyAPtr = &m_tmpSolverBodyPool[solverBodyIdA];
                    btSolverBody* bodyBPtr = &m_tmpSolverBodyPool[solverBodyIdB];




					int overrideNumSolverIterations = constraint->getOverrideNumSolverIterations() > 0 ? constraint->getOverrideNumSolverIterations() : infoGlobal.m_numIterations;
					if (overrideNumSolverIterations>m_maxOverrideNumSolverIterations)
						m_maxOverrideNumSolverIterations = overrideNumSolverIterations;


					int j;
					for ( j=0;j<info1.m_numConstraintRows;j++)
					{
						memset(&currentConstraintRow[j],0,sizeof(btSolverConstraint));
						currentConstraintRow[j].m_lowerLimit = -SIMD_INFINITY;
						currentConstraintRow[j].m_upperLimit = SIMD_INFINITY;
						currentConstraintRow[j].m_appliedImpulse = 0.f;
						currentConstraintRow[j].m_appliedPushImpulse = 0.f;
						currentConstraintRow[j].m_solverBodyIdA = solverBodyIdA;
						currentConstraintRow[j].m_solverBodyIdB = solverBodyIdB;
						currentConstraintRow[j].m_overrideNumSolverIterations = overrideNumSolverIterations;
					}

					bodyAPtr->internalGetDeltaLinearVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetDeltaAngularVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetPushVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetTurnVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetDeltaLinearVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetDeltaAngularVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetPushVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetTurnVelocity().setValue(0.f,0.f,0.f);


					btTypedConstraint::btConstraintInfo2 info2;
					info2.fps = 1.f/infoGlobal.m_timeStep;
					info2.erp = infoGlobal.m_erp;
					info2.m_J1linearAxis = currentConstraintRow->m_contactNormal1;
					info2.m_J1angularAxis = currentConstraintRow->m_relpos1CrossNormal;
					info2.m_J2linearAxis = currentConstraintRow->m_contactNormal2;
					info2.m_J2angularAxis = currentConstraintRow->m_relpos2CrossNormal;
					info2.rowskip = sizeof(btSolverConstraint)/sizeof(btScalar);//check this
					///the size of btSolverConstraint needs be a multiple of btScalar
		            btAssert(info2.rowskip*sizeof(btScalar)== sizeof(btSolverConstraint));
					info2.m_constraintError = &currentConstraintRow->m_rhs;
					currentConstraintRow->m_cfm = infoGlobal.m_globalCfm;
					info2.m_damping = infoGlobal.m_damping;
					info2.cfm = &currentConstraintRow->m_cfm;
					info2.m_lowerLimit = &currentConstraintRow->m_lowerLimit;
					info2.m_upperLimit = &currentConstraintRow->m_upperLimit;
					info2.m_numIterations = infoGlobal.m_numIterations;
					constraints[i]->getInfo2(&info2);

					///finalize the constraint setup
					for ( j=0;j<info1.m_numConstraintRows;j++)
					{
						btSolverConstraint& solverConstraint = currentConstraintRow[j];

						if (solverConstraint.m_upperLimit>=constraints[i]->getBreakingImpulseThreshold())
						{
							solverConstraint.m_upperLimit = constraints[i]->getBreakingImpulseThreshold();
						}

						if (solverConstraint.m_lowerLimit<=-constraints[i]->getBreakingImpulseThreshold())
						{
							solverConstraint.m_lowerLimit = -constraints[i]->getBreakingImpulseThreshold();
						}

						solverConstraint.m_originalContactPoint = constraint;

						{
							const btVector3& ftorqueAxis1 = solverConstraint.m_relpos1CrossNormal;
							solverConstraint.m_angularComponentA = constraint->getRigidBodyA().getInvInertiaTensorWorld()*ftorqueAxis1*constraint->getRigidBodyA().getAngularFactor();
						}
						{
							const btVector3& ftorqueAxis2 = solverConstraint.m_relpos2CrossNormal;
							solverConstraint.m_angularComponentB = constraint->getRigidBodyB().getInvInertiaTensorWorld()*ftorqueAxis2*constraint->getRigidBodyB().getAngularFactor();
						}

						{
							btVector3 iMJlA = solverConstraint.m_contactNormal1*rbA.getInvMass();
							btVector3 iMJaA = rbA.getInvInertiaTensorWorld()*solverConstraint.m_relpos1CrossNormal;
							btVector3 iMJlB = solverConstraint.m_contactNormal2*rbB.getInvMass();//sign of normal?
							btVector3 iMJaB = rbB.getInvInertiaTensorWorld()*solverConstraint.m_relpos2CrossNormal;

							btScalar sum = iMJlA.dot(solverConstraint.m_contactNormal1);
							sum += iMJaA.dot(solverConstraint.m_relpos1CrossNormal);
							sum += iMJlB.dot(solverConstraint.m_contactNormal2);
							sum += iMJaB.dot(solverConstraint.m_relpos2CrossNormal);
							btScalar fsum = btFabs(sum);
							btAssert(fsum > SIMD_EPSILON);
							solverConstraint.m_jacDiagABInv = fsum>SIMD_EPSILON?btScalar(1.)/sum : 0.f;
						}



						{
							btScalar rel_vel;
							btVector3 externalForceImpulseA = bodyAPtr->m_originalBody ? bodyAPtr->m_externalForceImpulse : btVector3(0,0,0);
							btVector3 externalTorqueImpulseA = bodyAPtr->m_originalBody ? bodyAPtr->m_externalTorqueImpulse : btVector3(0,0,0);

							btVector3 externalForceImpulseB = bodyBPtr->m_originalBody ? bodyBPtr->m_externalForceImpulse : btVector3(0,0,0);
							btVector3 externalTorqueImpulseB = bodyBPtr->m_originalBody ?bodyBPtr->m_externalTorqueImpulse : btVector3(0,0,0);

							btScalar vel1Dotn = solverConstraint.m_contactNormal1.dot(rbA.getLinearVelocity()+externalForceImpulseA)
												+ solverConstraint.m_relpos1CrossNormal.dot(rbA.getAngularVelocity()+externalTorqueImpulseA);

							btScalar vel2Dotn = solverConstraint.m_contactNormal2.dot(rbB.getLinearVelocity()+externalForceImpulseB)
																+ solverConstraint.m_relpos2CrossNormal.dot(rbB.getAngularVelocity()+externalTorqueImpulseB);

							rel_vel = vel1Dotn+vel2Dotn;
							btScalar restitution = 0.f;
							btScalar positionalError = solverConstraint.m_rhs;//already filled in by getConstraintInfo2
							btScalar	velocityError = restitution - rel_vel * info2.m_damping;
							btScalar	penetrationImpulse = positionalError*solverConstraint.m_jacDiagABInv;
							btScalar	velocityImpulse = velocityError *solverConstraint.m_jacDiagABInv;
							solverConstraint.m_rhs = penetrationImpulse+velocityImpulse;
							solverConstraint.m_appliedImpulse = 0.f;


						}
					}
				}
				currentRow+=m_tmpConstraintSizesPool[i].m_numConstraintRows;
			}
		}

		convertContacts(manifoldPtr,numManifolds,infoGlobal);

	}

//	btContactSolverInfo info = infoGlobal;


	int numNonContactPool = m_tmpSolverNonContactConstraintPool.size();
	int numConstraintPool = m_tmpSolverContactConstraintPool.size();
	int numFrictionPool = m_tmpSolverContactFrictionConstraintPool.size();

	///@todo: use stack allocator for such temporarily memory, same for solver bodies/constraints
	m_orderNonContactConstraintPool.resizeNoInitialize(numNonContactPool);
	if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
		m_orderTmpConstraintPool.resizeNoInitialize(numConstraintPool*2);
	else
		m_orderTmpConstraintPool.resizeNoInitialize(numConstraintPool);

	m_orderFrictionConstraintPool.resizeNoInitialize(numFrictionPool);
	{
		int i;
		for (i=0;i<numNonContactPool;i++)
		{
			m_orderNonContactConstraintPool[i] = i;
		}
		for (i=0;i<numConstraintPool;i++)
		{
			m_orderTmpConstraintPool[i] = i;
		}
		for (i=0;i<numFrictionPool;i++)
		{
			m_orderFrictionConstraintPool[i] = i;
		}
	}

	return 0.f;

}